

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O2

int kvtree_file_lock_read_write(char *file,int fd,int write)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  uint uVar4;
  
  uVar4 = 2 - (write == 0);
  iVar1 = flock(fd,uVar4);
  if (iVar1 != 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",file,fd,
               (ulong)uVar4,(ulong)__errnum,pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x98);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int kvtree_file_lock_read_write(const char* file, int fd, int write)
{
  #ifdef KVTREE_FILE_LOCK_USE_FLOCK
    int op;
    if (write) {
        op = LOCK_EX;
    } else {
        op = LOCK_SH;
    }
    if (flock(fd, op) != 0) {
      kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",
        file, fd, op, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  #ifdef KVTREE_FILE_LOCK_USE_FCNTL
    struct flock lck;
    if (write) {
      lck.l_type = F_WRLCK;
    } else {
      lck.l_type = F_RDLCK;
    }
    lck.l_whence = SEEK_SET;
    lck.l_start = 0L;
    lck.l_len = 0L; //locking the entire file

    if(fcntl(fd, F_SETLKW, &lck) < 0) {
      kvtree_err("Failed to acquire file read lock on %s: fnctl(%d, %d) errno=%d %s @ %s:%d",
        file, fd, F_WRLCK, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  return KVTREE_SUCCESS;
}